

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_function_set.cpp
# Opt level: O2

int64_t __thiscall
duckdb::CastFunctionSet::ImplicitCastCost
          (CastFunctionSet *this,LogicalType *source,LogicalType *target)

{
  MapCastNode *in_RAX;
  MapCastInfo *this_00;
  MapCastNode *pMVar1;
  int64_t iVar2;
  DBConfig *pDVar3;
  optional_ptr<duckdb::MapCastNode,_true> entry;
  optional_ptr<duckdb::MapCastNode,_true> local_28;
  
  local_28.ptr = in_RAX;
  if ((this->map_info).ptr != (MapCastInfo *)0x0) {
    this_00 = optional_ptr<duckdb::MapCastInfo,_true>::operator->(&this->map_info);
    local_28 = MapCastInfo::GetEntry(this_00,source,target);
    if (local_28.ptr != (MapCastNode *)0x0) {
      pMVar1 = optional_ptr<duckdb::MapCastNode,_true>::operator->(&local_28);
      return pMVar1->implicit_cast_cost;
    }
  }
  iVar2 = CastRules::ImplicitCast(source,target);
  if ((((iVar2 < 0) && ((this->config).ptr != (DBConfig *)0x0)) &&
      (pDVar3 = optional_ptr<duckdb::DBConfig,_true>::operator->(&this->config),
      (pDVar3->options).old_implicit_casting == true)) &&
     ((source->id_ != BLOB && (target->id_ == VARCHAR)))) {
    iVar2 = 0x95;
  }
  return iVar2;
}

Assistant:

int64_t CastFunctionSet::ImplicitCastCost(const LogicalType &source, const LogicalType &target) {
	// check if a cast has been registered
	if (map_info) {
		auto entry = map_info->GetEntry(source, target);
		if (entry) {
			return entry->implicit_cast_cost;
		}
	}
	// if not, fallback to the default implicit cast rules
	auto score = CastRules::ImplicitCast(source, target);
	if (score < 0 && config && config->options.old_implicit_casting) {
		if (source.id() != LogicalTypeId::BLOB && target.id() == LogicalTypeId::VARCHAR) {
			score = 149;
		}
	}
	return score;
}